

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.cpp
# Opt level: O0

void __thiscall chatra::Scope::Scope(Scope *this,Storage *storage,ScopeType type)

{
  Scope *local_30;
  lock_guard<chatra::SpinLock> local_28;
  lock_guard<chatra::SpinLock> lock;
  ScopeType type_local;
  Storage *storage_local;
  Scope *this_local;
  
  lock._M_device._4_4_ = type;
  AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
  ::AsyncRead(&this->
               super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
             );
  this->storage = storage;
  this->type = lock._M_device._4_4_;
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::vector(&this->groups);
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::vector(&this->nodes);
  this->nextId = 0xfffffffe;
  SpinLock::SpinLock(&this->lockAllocateCapture);
  std::atomic<bool>::atomic(&this->captured,false);
  std::lock_guard<chatra::SpinLock>::lock_guard(&local_28,&storage->lockScopes);
  local_30 = this;
  std::
  unordered_set<chatra::Scope*,std::hash<chatra::Scope*>,std::equal_to<chatra::Scope*>,std::allocator<chatra::Scope*>>
  ::emplace<chatra::Scope*>
            ((unordered_set<chatra::Scope*,std::hash<chatra::Scope*>,std::equal_to<chatra::Scope*>,std::allocator<chatra::Scope*>>
              *)&storage->scopes,&local_30);
  add(this,CapturedScope,0xffffffffffffffff);
  std::lock_guard<chatra::SpinLock>::~lock_guard(&local_28);
  return;
}

Assistant:

Scope::Scope(Storage& storage, ScopeType type) noexcept : storage(storage), type(type) {
	std::lock_guard<SpinLock> lock(storage.lockScopes);
	storage.scopes.emplace(this);
	add(StringId::CapturedScope, InvalidRequester);
}